

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (other == this) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x61d);
    other_00 = LogMessage::operator<<(&local_50,"CHECK failed: (&other) != (this): ");
    LogFinisher::operator=(&local_51,other_00);
    LogMessage::~LogMessage(&local_50);
  }
  if (other->current_size_ != 0) {
    MergeFromInternal(this,other,
                      (offset_in_RepeatedPtrFieldBase_to_subr)
                      MergeFromInnerLoop<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
                     );
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(
      other, &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}